

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

size_t scp_source_send(ScpServer *s,void *vdata,size_t length)

{
  char cVar1;
  size_t sVar2;
  char *fmt;
  byte bVar3;
  
  if (*(char *)((long)&s[-0x1a].vt + 7) == '\0') {
    if (length != 0) {
      bVar3 = *(byte *)((long)&s[-0x1a].vt + 4);
      sVar2 = 0;
      do {
        cVar1 = *(char *)((long)vdata + sVar2);
        if ((bVar3 & 1) == 0) {
          if (cVar1 == '\0') {
            *(int *)&s[-0x1a].vt = *(int *)&s[-0x1a].vt + 1;
          }
          else {
            if (cVar1 != '\x01') {
              if (cVar1 == '\x02') {
                fmt = "terminating on fatal error from client";
              }
              else {
                fmt = "unrecognised response code from client";
              }
              scp_source_abort((ScpSource *)(s + -0x1b),fmt);
              return 0;
            }
            *(undefined1 *)((long)&s[-0x1a].vt + 4) = 1;
            bVar3 = 1;
          }
        }
        else if (cVar1 == '\n') {
          *(undefined1 *)((long)&s[-0x1a].vt + 4) = 0;
          *(int *)&s[-0x1a].vt = *(int *)&s[-0x1a].vt + 1;
          bVar3 = 0;
        }
        sVar2 = sVar2 + 1;
      } while (length != sVar2);
    }
    scp_source_process_stack((ScpSource *)(s + -0x1b));
  }
  return 0;
}

Assistant:

static size_t scp_source_send(ScpServer *s, const void *vdata, size_t length)
{
    ScpSource *scp = container_of(s, ScpSource, scpserver);
    const char *data = (const char *)vdata;
    size_t i;

    if (scp->finished)
        return 0;

    for (i = 0; i < length; i++) {
        if (scp->expect_newline) {
            if (data[i] == '\012') {
                /* End of an error message following a 1 byte */
                scp->expect_newline = false;
                scp->acks++;
            }
        } else {
            switch (data[i]) {
              case 0:                  /* ordinary ack */
                scp->acks++;
                break;
              case 1:                  /* non-fatal error; consume it */
                scp->expect_newline = true;
                break;
              case 2:
                scp_source_abort(
                    scp, "terminating on fatal error from client");
                return 0;
              default:
                scp_source_abort(
                    scp, "unrecognised response code from client");
                return 0;
            }
        }
    }

    scp_source_process_stack(scp);

    return 0;
}